

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.h
# Opt level: O3

void __thiscall spvtools::opt::VectorDCE::VectorDCE(VectorDCE *this)

{
  pointer puVar1;
  uint32_t i;
  uint32_t i_00;
  
  MemPass::MemPass(&this->super_MemPass);
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)&PTR__VectorDCE_00936678;
  (this->all_components_live_).bits_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->all_components_live_).bits_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  i_00 = 0;
  (this->all_components_live_).bits_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(8);
  (this->all_components_live_).bits_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar1;
  (this->all_components_live_).bits_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar1 + 1;
  *puVar1 = 0;
  (this->all_components_live_).bits_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar1 + 1;
  do {
    utils::BitVector::Set(&this->all_components_live_,i_00);
    i_00 = i_00 + 1;
  } while (i_00 != 0x10);
  return;
}

Assistant:

VectorDCE() : all_components_live_(kMaxVectorSize) {
    for (uint32_t i = 0; i < kMaxVectorSize; i++) {
      all_components_live_.Set(i);
    }
  }